

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfmcs.cc
# Opt level: O3

InputGraph __thiscall
anon_unknown.dwarf_33d06f::read_vfmcs
          (anon_unknown_dwarf_33d06f *this,ifstream *infile,string *filename,bool vertex_labels,
          bool directed)

{
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  GraphFileError *pGVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type __n;
  undefined7 in_register_00000081;
  int r;
  bool bVar11;
  string_view l;
  string_view label;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  undefined4 local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000081,directed);
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar8 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"error reading size","");
    GraphFileError::GraphFileError(pGVar8,filename,&local_a0,true);
    __cxa_throw(pGVar8,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  InputGraph::InputGraph((InputGraph *)this,uVar2 & 0xff | (uVar3 & 0xff) << 8,vertex_labels,false);
  iVar4 = InputGraph::size((InputGraph *)this);
  uVar2 = 0x10;
  if (6 < iVar4) {
    iVar5 = 1;
    uVar3 = 0;
    do {
      iVar5 = iVar5 * 2;
      uVar2 = uVar3 + 1;
      if ((iVar4 * 0x21) / 100 <= iVar5) break;
      bVar11 = uVar3 < 0x10;
      uVar3 = uVar2;
    } while (bVar11);
    uVar2 = 0x11 - uVar2;
  }
  local_80 = filename;
  for (iVar4 = 0; iVar5 = InputGraph::size((InputGraph *)this), iVar4 < iVar5; iVar4 = iVar4 + 1) {
    uVar3 = std::istream::get();
    uVar6 = std::istream::get();
    if (vertex_labels) {
      __n = 1;
      uVar3 = (uVar3 & 0xff | (uVar6 & 0xff) << 8) >> (uVar2 & 0x1f);
      if (((9 < uVar3) && (__n = 2, 99 < uVar3)) && (__n = 3, 999 < uVar3)) {
        __n = 5 - (ulong)(uVar3 < 10000);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_a0,__n,'\0');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar3);
      l._M_str = local_a0._M_dataplus._M_p;
      l._M_len = local_a0._M_string_length;
      InputGraph::set_vertex_label((InputGraph *)this,iVar4,l);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar8 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"error reading attributes","");
    GraphFileError::GraphFileError(pGVar8,local_80,&local_a0,true);
    __cxa_throw(pGVar8,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  iVar4 = 0;
  while( true ) {
    iVar5 = InputGraph::size((InputGraph *)this);
    if (iVar5 <= iVar4) {
      std::istream::peek();
      uVar1._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
      super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
      super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl =
           *(__uniq_ptr_data<InputGraph::Imp,_std::default_delete<InputGraph::Imp>,_true,_true> *)
            &((__uniq_ptr_data<InputGraph::Imp,_std::default_delete<InputGraph::Imp>,_true,_true> *)
             (*(long *)infile + -0x18))->
             super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>;
      if (((byte)infile[(long)uVar1._M_t.
                              super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                              .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl + 0x20]
          & 2) == 0) {
        pGVar8 = (GraphFileError *)__cxa_allocate_exception(0x30);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"EOF not reached","");
        GraphFileError::GraphFileError(pGVar8,local_80,&local_a0,true);
        __cxa_throw(pGVar8,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             uVar1._M_t.
             super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
             super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
             super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
    }
    uVar2 = std::istream::get();
    uVar3 = std::istream::get();
    if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) break;
    for (uVar2 = (uVar3 & 0xff) << 8 | uVar2 & 0xff; uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar3 = std::istream::get();
      uVar6 = std::istream::get();
      uVar7 = InputGraph::size((InputGraph *)this);
      uVar3 = (uVar6 & 0xff) << 8 | uVar3 & 0xff;
      if (uVar7 <= uVar3) {
        pGVar8 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::to_string(&local_70,uVar3);
        std::operator+(&local_50,"edge index ",&local_70);
        pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50," out of bounds");
        paVar10 = &pbVar9->field_2;
        local_a0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar10) {
          local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_a0._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar9->_M_string_length = 0;
        (pbVar9->field_2)._M_local_buf[0] = '\0';
        GraphFileError::GraphFileError(pGVar8,local_80,&local_a0,true);
        __cxa_throw(pGVar8,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      if ((char)local_74 == '\0') {
        InputGraph::add_edge((InputGraph *)this,iVar4,uVar3);
      }
      else {
        label._M_str = "directed";
        label._M_len = 8;
        InputGraph::add_directed_edge((InputGraph *)this,iVar4,uVar3,label);
      }
      std::istream::get();
      std::istream::get();
    }
    iVar4 = iVar4 + 1;
  }
  pGVar8 = (GraphFileError *)__cxa_allocate_exception(0x30);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"error reading edges count","");
  GraphFileError::GraphFileError(pGVar8,local_80,&local_a0,true);
  __cxa_throw(pGVar8,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_vfmcs(ifstream && infile, const string & filename, bool vertex_labels, bool directed) -> InputGraph
    {
        int size = read_word(infile);
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        InputGraph result{size, vertex_labels, false};

        // to be like the CP 2011 labelling scheme...
        int m = result.size() * 33 / 100;
        int p = 1, k1 = 0, k2 = 0;
        while (p < m && k1 < 16) {
            p *= 2;
            k1 = k2;
            k2++;
        }

        for (int r = 0; r < result.size(); ++r) {
            unsigned l = read_word(infile) >> (16 - k1);
            if (vertex_labels)
                result.set_vertex_label(r, to_string(l));
        }

        if (! infile)
            throw GraphFileError{filename, "error reading attributes", true};

        for (int r = 0; r < result.size(); ++r) {
            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                unsigned e = read_word(infile);

                if (e >= unsigned(result.size()))
                    throw GraphFileError{filename, "edge index " + to_string(e) + " out of bounds", true};

                if (directed)
                    result.add_directed_edge(r, e, "directed");
                else
                    result.add_edge(r, e);
                read_word(infile);
            }
        }

        infile.peek();
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }